

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O0

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  ImDrawCmd *pIVar5;
  ImDrawList *pIVar6;
  undefined4 uVar8;
  long in_RDI;
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  int cmd_i;
  ImDrawIdx *idx_buffer;
  ImDrawVert *vtx_buffer;
  ImDrawList *cmd_list;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLint last_texture;
  int fb_height;
  int fb_width;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  int local_84;
  unsigned_short *local_80;
  int local_64;
  float local_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  int local_10;
  int local_c;
  long local_8;
  undefined4 uVar7;
  
  local_c = (int)(*(float *)(in_RDI + 0x20) * *(float *)(in_RDI + 0x28));
  local_10 = (int)(*(float *)(in_RDI + 0x24) * *(float *)(in_RDI + 0x2c));
  if ((local_c != 0) && (local_10 != 0)) {
    local_8 = in_RDI;
    glGetIntegerv(0x8069,&local_14);
    glGetIntegerv(0xb40,&local_1c);
    glGetIntegerv(0xba2,&local_38);
    glGetIntegerv(0xc10,&local_48);
    glGetIntegerv(0xb54,&local_4c);
    glGetTexEnviv(0x2300,0x2200,&local_50);
    glPushAttrib(0x7000);
    ImGui_ImplOpenGL2_SetupRenderState
              ((ImDrawData *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    uVar1 = *(undefined8 *)(local_8 + 0x18);
    uVar2 = *(undefined8 *)(local_8 + 0x28);
    for (local_64 = 0; local_64 < *(int *)(local_8 + 4); local_64 = local_64 + 1) {
      pIVar3 = *(ImDrawList **)(*(long *)(local_8 + 0x10) + (long)local_64 * 8);
      pIVar4 = (pIVar3->VtxBuffer).Data;
      local_80 = (pIVar3->IdxBuffer).Data;
      glVertexPointer(2,0x1406,0x14,pIVar4);
      glTexCoordPointer(2,0x1406,0x14,&pIVar4->uv);
      glColorPointer(4,0x1401,0x14,&pIVar4->col);
      for (local_84 = 0; local_84 < (pIVar3->CmdBuffer).Size; local_84 = local_84 + 1) {
        uVar8 = 0;
        pIVar6 = pIVar3;
        pIVar5 = ImVector<ImDrawCmd>::operator[]
                           ((ImVector<ImDrawCmd> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c);
        uVar7 = (undefined4)((ulong)pIVar6 >> 0x20);
        if (pIVar5->UserCallback == (ImDrawCallback)0x0) {
          ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff60);
          local_58 = (float)uVar1;
          local_60 = (float)uVar2;
          in_stack_ffffffffffffff60 = ((pIVar5->ClipRect).x - local_58) * local_60;
          fStack_54 = (float)((ulong)uVar1 >> 0x20);
          fStack_5c = (float)((ulong)uVar2 >> 0x20);
          in_stack_ffffffffffffff64 = ((pIVar5->ClipRect).y - fStack_54) * fStack_5c;
          local_60 = ((pIVar5->ClipRect).z - local_58) * local_60;
          fStack_5c = ((pIVar5->ClipRect).w - fStack_54) * fStack_5c;
          if ((((in_stack_ffffffffffffff60 < (float)local_c) &&
               (in_stack_ffffffffffffff64 < (float)local_10)) && (0.0 <= local_60)) &&
             (0.0 <= fStack_5c)) {
            glScissor((int)in_stack_ffffffffffffff60,
                      CONCAT44(uVar8,(int)((float)local_10 - fStack_5c)),
                      (int)(local_60 - in_stack_ffffffffffffff60),
                      CONCAT44(uVar7,(int)(fStack_5c - in_stack_ffffffffffffff64)));
            glBindTexture(0xde1,(ulong)pIVar5->TextureId & 0xffffffff);
            glDrawElements(4,pIVar5->ElemCount,0x1403,local_80);
          }
        }
        else if (pIVar5->UserCallback == (ImDrawCallback)0xffffffffffffffff) {
          ImGui_ImplOpenGL2_SetupRenderState
                    ((ImDrawData *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        }
        else {
          (*pIVar5->UserCallback)(pIVar3,pIVar5);
        }
        local_80 = local_80 + pIVar5->ElemCount;
      }
    }
    glDisableClientState(0x8076);
    glDisableClientState(0x8078);
    glDisableClientState(0x8074);
    glBindTexture(0xde1,local_14);
    glMatrixMode(0x1700);
    glPopMatrix();
    glMatrixMode(0x1701);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(0x404,local_1c);
    glPolygonMode(0x405,local_18);
    glViewport(local_38,local_34,local_30,local_2c);
    glScissor(local_48,local_44,local_40,local_3c);
    glShadeModel(local_4c);
    glTexEnvi(0x2300,0x2200,local_50);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model; glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer);
                }
            }
            idx_buffer += pcmd->ElemCount;
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}